

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_compression.c
# Opt level: O0

int decompress_certificate
              (ptls_decompress_certificate_t *self,ptls_t *tls,uint16_t algorithm,
              ptls_iovec_t output,ptls_iovec_t input)

{
  int iVar1;
  uint8_t *local_40;
  size_t decoded_size;
  ptls_t *ppStack_30;
  uint16_t algorithm_local;
  ptls_t *tls_local;
  ptls_decompress_certificate_t *self_local;
  ptls_iovec_t output_local;
  
  local_40 = (uint8_t *)output.len;
  self_local = (ptls_decompress_certificate_t *)output.base;
  if (algorithm == 2) {
    decoded_size._6_2_ = algorithm;
    ppStack_30 = tls;
    tls_local = (ptls_t *)self;
    output_local.base = local_40;
    iVar1 = BrotliDecoderDecompress(input.len,input.base,&local_40,self_local);
    if ((iVar1 == 1) && (local_40 == output_local.base)) {
      return 0;
    }
  }
  return 0x2a;
}

Assistant:

static inline int decompress_certificate(ptls_decompress_certificate_t *self, ptls_t *tls, uint16_t algorithm, ptls_iovec_t output,
                                         ptls_iovec_t input)
{
    if (algorithm != PTLS_CERTIFICATE_COMPRESSION_ALGORITHM_BROTLI)
        goto Fail;

    size_t decoded_size = output.len;
    if (BrotliDecoderDecompress(input.len, input.base, &decoded_size, output.base) != BROTLI_DECODER_RESULT_SUCCESS)
        goto Fail;

    if (decoded_size != output.len)
        goto Fail;

    return 0;
Fail:
    return PTLS_ALERT_BAD_CERTIFICATE;
}